

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O1

prf_node_t * prf_texture_node_create(prf_model_t *model,int index,char *filename)

{
  uint8_t *__dest;
  prf_node_t *ppVar1;
  
  ppVar1 = prf_node_create_etc(model,0xd4);
  if (ppVar1 != (prf_node_t *)0x0) {
    ppVar1->opcode = 0x40;
    ppVar1->length = 0xd8;
    __dest = ppVar1->data;
    *(int *)(__dest + 200) = index;
    __dest[0xcc] = '\0';
    __dest[0xcd] = '\0';
    __dest[0xce] = '\0';
    __dest[0xcf] = '\0';
    __dest[0xd0] = '\0';
    __dest[0xd1] = '\0';
    __dest[0xd2] = '\0';
    __dest[0xd3] = '\0';
    strncpy((char *)__dest,filename,200);
  }
  return ppVar1;
}

Assistant:

prf_node_t *
prf_texture_node_create(
    prf_model_t * model,
    int index,
    const char * filename )
{
    prf_node_t * node =
        prf_node_create_etc( model, sizeof( struct prf_texture_data ) );
    if ( node ) {
        struct prf_texture_data * data;
        node->opcode = 64;
        node->length = 4 + sizeof( struct prf_texture_data );
        data = (struct prf_texture_data *) node->data;
        data->pattern_index = index;
        data->x_location = 0;
        data->y_location = 0;
        strncpy( data->filename, filename, 200 );
    }
    return node;
}